

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_TxInTest_Test::~ConfidentialTransaction_TxInTest_Test
          (ConfidentialTransaction_TxInTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, TxInTest) {
  ConfidentialTransaction tx(2, static_cast<uint32_t>(0));
  EXPECT_NO_THROW((tx = ConfidentialTransaction(exp_tx_hex)));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  // GetTxIn
  ConfidentialTxInReference txin_ref;
  EXPECT_THROW((txin_ref = tx.GetTxIn(1)), CfdException);
  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(0)));
  EXPECT_STREQ(
      txin_ref.GetTxid().GetHex().c_str(),
      "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  EXPECT_EQ(txin_ref.GetVout(), 1);
  EXPECT_EQ(txin_ref.GetSequence(), 0xffffffff);
  EXPECT_STREQ(
      txin_ref.GetBlindingNonce().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(
      txin_ref.GetAssetEntropy().GetHex().c_str(),
      "0000000000000000000000000000000000000000000000000000000000000000");
  EXPECT_STREQ(txin_ref.GetIssuanceAmount().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetInflationKeys().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetIssuanceAmountRangeproof().GetHex().c_str(), "");
  EXPECT_STREQ(txin_ref.GetInflationKeysRangeproof().GetHex().c_str(), "");

  // GetTxInIndex, AddTxIn
  uint32_t index = 0;
  uint32_t add_index;
  EXPECT_THROW((index = tx.GetTxInIndex(exp_txid, exp_index)), CfdException);

  EXPECT_NO_THROW(
      (add_index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW((index = tx.GetTxInIndex(exp_txid, exp_index)));
  EXPECT_EQ(add_index, 1);
  EXPECT_EQ(index, 1);
  EXPECT_EQ(tx.GetTxInCount(), 2);
  // mask check
  EXPECT_NO_THROW((index = tx.GetTxInIndex(exp_txid, exp_index | 0x80000000)));
  EXPECT_EQ(index, 1);

  // GetTxInList
  std::vector<ConfidentialTxInReference> ref_list;
  EXPECT_NO_THROW((ref_list = tx.GetTxInList()));
  EXPECT_EQ(ref_list.size(), 2);
  EXPECT_STREQ(
      ref_list[0].GetTxid().GetHex().c_str(),
      "56eb4a177459bae6d310cd117dde5ff86e0a6572d44dcf5e25e611435fff9b31");
  EXPECT_EQ(ref_list[0].GetVout(), 1);
  EXPECT_EQ(ref_list[0].GetSequence(), 0xffffffff);
  EXPECT_STREQ(ref_list[1].GetTxid().GetHex().c_str(),
               exp_txid.GetHex().c_str());
  EXPECT_EQ(ref_list[1].GetVout(), exp_index);
  EXPECT_EQ(ref_list[1].GetSequence(), exp_sequence);

  // RemoveTxIn
  EXPECT_THROW((tx.RemoveTxIn(5)), CfdException);
  EXPECT_NO_THROW((tx.RemoveTxIn(1)));
  EXPECT_EQ(tx.GetTxInCount(), 1);
}